

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bernoulli_dist.hpp
# Opt level: O2

double __thiscall trng::bernoulli_dist<int>::cdf(bernoulli_dist<int> *this,int *x)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  
  iVar1 = (this->P).head_;
  iVar2 = (this->P).tail_;
  iVar3 = *x;
  dVar4 = 0.0;
  if (iVar1 < iVar2) {
    if (iVar1 <= iVar3) {
      if (iVar2 <= iVar3) {
        return 1.0;
      }
      return (this->P).p_;
    }
  }
  else if (iVar2 <= iVar3) {
    if (iVar1 <= iVar3) {
      return 1.0;
    }
    dVar4 = 1.0 - (this->P).p_;
  }
  return dVar4;
}

Assistant:

TRNG_CUDA_ENABLE
      T head() const { return head_; }